

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  float ***pppfVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  IOException *this_00;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int d;
  ulong uVar14;
  long lVar15;
  long i;
  ulong uVar16;
  ulong uVar17;
  valarray<int> nline;
  int subbit;
  undefined4 uStack_344;
  valarray<float> vline;
  long local_2e0;
  int depth;
  ulong local_2d0;
  pos_type local_2c8;
  ulong local_2b8;
  ulong local_2b0;
  long height;
  long width;
  long local_298;
  long local_290;
  long local_288;
  ulong local_280;
  ulong local_278;
  long local_270;
  long maxval;
  float scale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  
  bVar4 = gutil::isMSBFirst();
  iVar5 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar5 == '\0') {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&nline,name,(allocator *)&subbit);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   "Can only load PNM image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
    gutil::IOException::IOException(this_00,(string *)&in);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_2c8 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  if ((scale != 0.0) || (NAN(scale))) {
    uVar12 = 1;
    if (1 < ds) {
      uVar12 = (ulong)(uint)ds;
    }
    if (w < 0) {
      w = (long)(width + uVar12 + -1) / (long)uVar12;
    }
    if (h < 0) {
      h = (long)(height + uVar12 + -1) / (long)uVar12;
    }
    lVar11 = (long)depth;
    Image<float,_gimage::PixelTraits<float>_>::setSize(image,w,h,lVar11);
    Image<float,_gimage::PixelTraits<float>_>::clear(image);
    std::ifstream::ifstream(&in);
    std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
    std::ifstream::open((char *)&in,(_Ios_Openmode)name);
    if ((((ds < 2) && (y == 0 && x == 0)) && (w == width)) && (h == height)) {
      std::istream::seekg(&in,local_2c8._M_off,local_2c8._M_state);
      bVar3 = 0.0 <= scale;
      if (bVar4) {
        bVar3 = scale <= 0.0;
      }
      uVar12 = (ulong)(uint)depth;
      if (depth < 1) {
        uVar12 = 0;
      }
      if (w < 1) {
        w = 0;
      }
      while (0 < h) {
        h = h + -1;
        for (uVar16 = 0; uVar16 != w; uVar16 = uVar16 + 1) {
          for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
            if (bVar3) {
              iVar5 = std::streambuf::sbumpc();
              uVar6 = std::streambuf::sbumpc();
              uVar7 = std::streambuf::sbumpc();
              uVar8 = std::streambuf::sbumpc();
              uVar9 = (uVar7 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | iVar5 << 0x18;
              uVar8 = uVar8 & 0xff;
            }
            else {
              uVar8 = std::streambuf::sbumpc();
              uVar6 = std::streambuf::sbumpc();
              uVar7 = std::streambuf::sbumpc();
              iVar5 = std::streambuf::sbumpc();
              uVar9 = iVar5 << 0x18;
              uVar8 = (uVar7 & 0xff) << 0x10 | (uVar6 & 0xff) << 8 | uVar8 & 0xff;
            }
            image->img[uVar14][h][uVar16] = (float)(uVar8 | uVar9);
          }
        }
      }
    }
    else {
      nline._M_size._0_4_ = 0;
      std::valarray<float>::valarray(&vline,(float *)&nline,w * lVar11);
      subbit = 0;
      std::valarray<int>::valarray(&nline,&subbit,w * lVar11);
      local_2b0 = 0;
      uVar16 = -y;
      if (-y == 0 || 0 < y) {
        uVar16 = local_2b0;
      }
      local_290 = 0;
      if (0 < x) {
        local_290 = x;
      }
      local_290 = local_290 * uVar12;
      uVar14 = -x;
      if (-x == 0 || 0 < x) {
        uVar14 = local_2b0;
      }
      lVar10 = uVar14 * lVar11;
      local_298 = lVar11 * 4;
      bVar3 = 0.0 <= scale;
      if (bVar4) {
        bVar3 = scale <= 0.0;
      }
      if (0 < depth) {
        local_2b0 = (ulong)(uint)depth;
      }
      while( true ) {
        if ((h <= (long)uVar16) || (local_2d0 = (uVar16 + y) * uVar12, height <= (long)local_2d0))
        break;
        subbit = 0;
        local_2b8 = uVar16;
        std::valarray<float>::operator=(&vline,(float *)&subbit);
        subbit = 0;
        std::valarray<int>::operator=(&nline,&subbit);
        local_288 = ~local_2d0 + height;
        uVar16 = 0;
        while ((lVar15 = lVar10, uVar17 = uVar14, uVar16 < uVar12 &&
               ((long)(local_2d0 + uVar16) < height))) {
          std::istream::seekg(&in,((local_288 - uVar16) * width + local_290) * local_298 +
                                  local_2c8._M_off,local_2c8._M_state);
          local_2e0 = lVar10;
          local_280 = uVar16;
          while (((long)uVar17 < w && (local_270 = (x + uVar17) * uVar12, local_270 < width))) {
            local_278 = uVar17;
            for (uVar16 = 0;
                (uVar16 < uVar12 &&
                (lVar15 = local_2e0, uVar17 = local_2b0, (long)(local_270 + uVar16) < width));
                uVar16 = uVar16 + 1) {
              while (bVar4 = uVar17 != 0, uVar17 = uVar17 - 1, bVar4) {
                if (bVar3) {
                  iVar5 = std::streambuf::sbumpc();
                  uVar6 = std::streambuf::sbumpc();
                  uVar7 = std::streambuf::sbumpc();
                  uVar8 = std::streambuf::sbumpc();
                  uVar9 = (uVar7 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | iVar5 << 0x18;
                  uVar8 = uVar8 & 0xff;
                }
                else {
                  uVar8 = std::streambuf::sbumpc();
                  uVar6 = std::streambuf::sbumpc();
                  uVar7 = std::streambuf::sbumpc();
                  iVar5 = std::streambuf::sbumpc();
                  uVar9 = iVar5 << 0x18;
                  uVar8 = (uVar7 & 0xff) << 0x10 | (uVar6 & 0xff) << 8 | uVar8 & 0xff;
                }
                if ((uVar8 | uVar9 & 0x7fffffff) < 0x7f800000) {
                  *(float *)(CONCAT44(vline._M_data._4_4_,vline._M_data._0_4_) + lVar15 * 4) =
                       (float)(uVar8 | uVar9) +
                       *(float *)(CONCAT44(vline._M_data._4_4_,vline._M_data._0_4_) + lVar15 * 4);
                  nline._M_data[lVar15] = nline._M_data[lVar15] + 1;
                }
                lVar15 = lVar15 + 1;
              }
            }
            local_2e0 = local_2e0 + lVar11;
            uVar17 = local_278 + 1;
          }
          uVar16 = local_280 + 1;
        }
        for (; ((long)uVar17 < w && ((long)((x + uVar17) * uVar12) < width)); uVar17 = uVar17 + 1) {
          pppfVar1 = image->img;
          for (uVar16 = 0; local_2b0 != uVar16; uVar16 = uVar16 + 1) {
            if (0 < nline._M_data[lVar15 + uVar16]) {
              pppfVar1[uVar16][local_2b8][uVar17] =
                   *(float *)(CONCAT44(vline._M_data._4_4_,vline._M_data._0_4_) + lVar15 * 4 +
                             uVar16 * 4) / (float)nline._M_data[lVar15 + uVar16];
            }
          }
          lVar15 = lVar15 + uVar16;
        }
        uVar16 = local_2b8 + 1;
      }
      operator_delete(nline._M_data);
      operator_delete((void *)CONCAT44(vline._M_data._4_4_,vline._M_data._0_4_));
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return;
  }
  if (maxval < 0x100) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
    (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
              (this,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,name,
               (ulong)(uint)ds,x,y,w,h);
    Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_char>
              (image,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    return;
  }
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in,0,0,1);
  (*(this->super_BasicImageIO)._vptr_BasicImageIO[7])
            (this,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in,name,
             (ulong)(uint)ds,x,y,w,h);
  Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_short>
            (image,(Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in);
  std::__cxx11::string::string((string *)&nline,name,(allocator *)&vline);
  lVar11 = std::__cxx11::string::rfind((char *)&nline,0x15c340);
  if (lVar11 == (long)nline._M_data + -9) {
    std::__cxx11::string::rfind((char *)&nline,0x15c340);
    std::__cxx11::string::substr((ulong)&vline,(ulong)&nline);
  }
  else {
    lVar11 = std::__cxx11::string::rfind((char *)&nline,0x15c34a);
    if (lVar11 != (long)nline._M_data + -0xb) {
      std::__cxx11::string::assign((char *)&nline);
      goto LAB_0013a933;
    }
    std::__cxx11::string::rfind((char *)&nline,0x15c34a);
    std::__cxx11::string::substr((ulong)&vline,(ulong)&nline);
  }
  std::__cxx11::string::operator=((string *)&nline,(string *)&vline);
  std::__cxx11::string::~string((string *)&vline);
LAB_0013a933:
  if (nline._M_data != (int *)0x0) {
    vline._M_data._0_4_ = 0;
    lVar11 = std::__cxx11::string::rfind((char)&nline,0x5f);
    if ((lVar11 != -1) && (lVar11 = std::__cxx11::string::rfind((char)&nline,0x5f), lVar11 != -1)) {
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&nline);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subbit,
                     &local_258,"_param.txt");
      gutil::Properties::load((Properties *)&vline,(char *)CONCAT44(uStack_344,subbit));
      std::__cxx11::string::~string((string *)&subbit);
      std::__cxx11::string::~string((string *)&local_258);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&subbit,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "_param.txt");
    gutil::Properties::load((Properties *)&vline,(char *)CONCAT44(uStack_344,subbit));
    std::__cxx11::string::~string((string *)&subbit);
    bVar4 = gutil::Properties::contains((Properties *)&vline,"subbit");
    if (bVar4) {
      lVar10 = 0;
      lVar11 = image->width;
      if (image->width < 1) {
        lVar11 = lVar10;
      }
      lVar15 = image->height;
      if (image->height < 1) {
        lVar15 = lVar10;
      }
      for (; lVar10 != lVar15; lVar10 = lVar10 + 1) {
        pppfVar1 = image->img;
        for (lVar13 = 0; lVar11 != lVar13; lVar13 = lVar13 + 1) {
          if (32767.0 < (*pppfVar1)[lVar10][lVar13]) {
            (*pppfVar1)[lVar10][lVar13] = INFINITY;
          }
        }
      }
      gutil::Properties::getValue<int>((Properties *)&vline,"subbit",&subbit,(char *)0x0);
      if (0 < subbit) {
        operator/=(image,(double)(1 << ((byte)subbit & 0x1f)));
      }
    }
    bVar4 = gutil::Properties::contains((Properties *)&vline,"origin.d");
    if (bVar4) {
      gutil::Properties::getValue<double>
                ((Properties *)&vline,"origin.d",(double *)&subbit,(char *)0x0);
      dVar2 = (double)CONCAT44(uStack_344,subbit);
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        operator+=(image,(float)dVar2);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&vline);
  }
  std::__cxx11::string::~string((string *)&nline);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)&in);
  return;
}

Assistant:

void PNMImageIO::load(ImageFloat &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;
  float p;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<float> vline(0.0f, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>(height-1-(y+k)*ds-kk)*width*depth*4+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*4);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  // we assume that the plattform uses IEEE 32 bit floating
                  // point format, otherwise this will not work

                  if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
                  {
                    c[0]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[3]=sb->sbumpc();
                  }
                  else
                  {
                    c[3]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[0]=sb->sbumpc();
                  }

                  if (image.isValidS(p))
                  {
                    vline[j+d]+=p;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, vline[j]/nline[j]);
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=height-1; k>=0; k--)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              // we assume that the plattform uses IEEE 32 bit floating
              // point format, otherwise this will not work

              if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
              {
                c[0]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[3]=sb->sbumpc();
              }
              else
              {
                c[3]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[0]=sb->sbumpc();
              }

              image.set(i, k, d, p);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else if (maxval > 255)
  {
    ImageU16 imageu16;
    load(imageu16, name, ds, x, y, w, h);
    image.setImageLimited(imageu16);

    // support for reading legacy disparity images in fixed point format

    std::string s=name;

    if (s.rfind("_disp.pgm") == s.size()-9)
    {
      s=s.substr(0, s.rfind("_disp.pgm"));
    }
    else if (s.rfind("_height.pgm") == s.size()-11)
    {
      s=s.substr(0, s.rfind("_height.pgm"));
    }
    else
    {
      s="";
    }

    if (s.size() > 0)
    {
      gutil::Properties prop;

      try
      {
        size_t pos=s.rfind('_');

        if (pos != s.npos)
        {
          pos=s.rfind('_', pos-1);
        }

        if (pos != s.npos)
        {
          prop.load((s.substr(0, pos)+"_param.txt").c_str());
        }
      }
      catch (const std::exception &)
      { }

      try
      {
        prop.load((s+"_param.txt").c_str());
      }
      catch (const std::exception &)
      { }

      if (prop.contains("subbit"))
      {
        // invalid disparities in legacy disparity images have a value > 32767

        for (long k=0; k<image.getHeight(); k++)
        {
          for (long i=0; i<image.getWidth(); i++)
          {
            if (image.get(i, k) > 32767)
            {
              image.setInvalid(i, k, 0);
            }
          }
        }

        // consider sub-pixel setting

        int subbit;
        prop.getValue("subbit", subbit);

        if (subbit > 0)
        {
          image/=1<<subbit;
        }
      }

      // consider offset

      if (prop.contains("origin.d"))
      {
        double offset;
        prop.getValue("origin.d", offset);

        if (offset != 0)
        {
          image+=static_cast<float>(offset);
        }
      }
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}